

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int lookup_address_and_initiate_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  int local_14;
  int result;
  SOCKET_IO_INSTANCE *socket_io_instance_local;
  
  local_14 = lookup_address(socket_io_instance);
  if ((socket_io_instance->io_state == IO_STATE_OPEN) && (local_14 == 0)) {
    local_14 = initiate_socket_connection(socket_io_instance);
  }
  return local_14;
}

Assistant:

static int lookup_address_and_initiate_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;

    result = lookup_address(socket_io_instance);

    if(socket_io_instance->io_state == IO_STATE_OPEN)
    {
        if (result == 0)
        {
            result = initiate_socket_connection(socket_io_instance);
        }
    }

    return result;
}